

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int rar_br_fillup(archive_read *a,rar_br *br)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte *pbVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  archive_read *in_RSI;
  long in_RDI;
  int n;
  rar *rar;
  int64_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  size_t min;
  
  min = **(size_t **)(in_RDI + 0x948);
  iVar5 = 0x40 - *(int *)&(in_RSI->archive).vtable;
  do {
    switch((archive_read *)(ulong)(uint)(iVar5 >> 3)) {
    case (archive_read *)0x0:
      return 1;
    default:
      break;
    case (archive_read *)0x6:
      if (5 < *(long *)&(in_RSI->archive).archive_format) {
        lVar2._0_4_ = (in_RSI->archive).magic;
        lVar2._4_4_ = (in_RSI->archive).state;
        uVar7 = lVar2 << 0x30 | (ulong)(byte)*(in_RSI->archive).archive_format_name << 0x28 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[1] << 0x20 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[2] << 0x18 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[3] << 0x10 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[4] << 8 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[5];
        (in_RSI->archive).magic = (int)uVar7;
        (in_RSI->archive).state = (int)(uVar7 >> 0x20);
        (in_RSI->archive).archive_format_name = (in_RSI->archive).archive_format_name + 6;
        *(long *)&(in_RSI->archive).archive_format = *(long *)&(in_RSI->archive).archive_format + -6
        ;
        *(int *)&(in_RSI->archive).vtable = *(int *)&(in_RSI->archive).vtable + 0x30;
        *(long *)(min + 0x98) = *(long *)(min + 0x98) + 6;
        *(long *)(min + 0xa0) = *(long *)(min + 0xa0) + -6;
        return 1;
      }
      break;
    case (archive_read *)0x7:
      if (6 < *(long *)&(in_RSI->archive).archive_format) {
        lVar1._0_4_ = (in_RSI->archive).magic;
        lVar1._4_4_ = (in_RSI->archive).state;
        uVar7 = lVar1 << 0x38 | (ulong)(byte)*(in_RSI->archive).archive_format_name << 0x30 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[1] << 0x28 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[2] << 0x20 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[3] << 0x18 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[4] << 0x10 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[5] << 8 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[6];
        (in_RSI->archive).magic = (int)uVar7;
        (in_RSI->archive).state = (int)(uVar7 >> 0x20);
        (in_RSI->archive).archive_format_name = (in_RSI->archive).archive_format_name + 7;
        *(long *)&(in_RSI->archive).archive_format = *(long *)&(in_RSI->archive).archive_format + -7
        ;
        *(int *)&(in_RSI->archive).vtable = *(int *)&(in_RSI->archive).vtable + 0x38;
        *(long *)(min + 0x98) = *(long *)(min + 0x98) + 7;
        *(long *)(min + 0xa0) = *(long *)(min + 0xa0) + -7;
        return 1;
      }
      break;
    case (archive_read *)0x8:
      if (7 < *(long *)&(in_RSI->archive).archive_format) {
        uVar7 = (ulong)(byte)*(in_RSI->archive).archive_format_name << 0x38 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[1] << 0x30 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[2] << 0x28 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[3] << 0x20 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[4] << 0x18 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[5] << 0x10 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[6] << 8 |
                (ulong)(byte)(in_RSI->archive).archive_format_name[7];
        (in_RSI->archive).magic = (int)uVar7;
        (in_RSI->archive).state = (int)(uVar7 >> 0x20);
        (in_RSI->archive).archive_format_name = (in_RSI->archive).archive_format_name + 8;
        *(long *)&(in_RSI->archive).archive_format = *(long *)&(in_RSI->archive).archive_format + -8
        ;
        *(int *)&(in_RSI->archive).vtable = *(int *)&(in_RSI->archive).vtable + 0x40;
        *(long *)(min + 0x98) = *(long *)(min + 0x98) + 8;
        *(long *)(min + 0xa0) = *(long *)(min + 0xa0) + -8;
        return 1;
      }
    }
    if (*(long *)&(in_RSI->archive).archive_format < 1) {
      if (0 < *(long *)(min + 0x98)) {
        __archive_read_consume((archive_read *)(ulong)(uint)(iVar5 >> 3),in_stack_ffffffffffffffc8);
        *(undefined8 *)(min + 0x98) = 0;
      }
      pcVar6 = (char *)rar_read_ahead(in_RSI,min,
                                      (ssize_t *)CONCAT44(iVar5,in_stack_ffffffffffffffd8));
      (in_RSI->archive).archive_format_name = pcVar6;
      if ((in_RSI->archive).archive_format_name == (char *)0x0) {
        return 0;
      }
      if (*(long *)&(in_RSI->archive).archive_format == 0) {
        return 0;
      }
    }
    lVar3._0_4_ = (in_RSI->archive).magic;
    lVar3._4_4_ = (in_RSI->archive).state;
    pbVar4 = (byte *)(in_RSI->archive).archive_format_name;
    (in_RSI->archive).archive_format_name = (char *)(pbVar4 + 1);
    uVar7 = lVar3 << 8 | (ulong)*pbVar4;
    (in_RSI->archive).magic = (int)uVar7;
    (in_RSI->archive).state = (int)(uVar7 >> 0x20);
    *(long *)&(in_RSI->archive).archive_format = *(long *)&(in_RSI->archive).archive_format + -1;
    *(int *)&(in_RSI->archive).vtable = *(int *)&(in_RSI->archive).vtable + 8;
    iVar5 = iVar5 + -8;
    *(long *)(min + 0x98) = *(long *)(min + 0x98) + 1;
    *(long *)(min + 0xa0) = *(long *)(min + 0xa0) + -1;
  } while( true );
}

Assistant:

static int
rar_br_fillup(struct archive_read *a, struct rar_br *br)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int n = CACHE_BITS - br->cache_avail;

  for (;;) {
    switch (n >> 3) {
    case 8:
      if (br->avail_in >= 8) {
        br->cache_buffer =
            ((uint64_t)br->next_in[0]) << 56 |
            ((uint64_t)br->next_in[1]) << 48 |
            ((uint64_t)br->next_in[2]) << 40 |
            ((uint64_t)br->next_in[3]) << 32 |
            ((uint32_t)br->next_in[4]) << 24 |
            ((uint32_t)br->next_in[5]) << 16 |
            ((uint32_t)br->next_in[6]) << 8 |
             (uint32_t)br->next_in[7];
        br->next_in += 8;
        br->avail_in -= 8;
        br->cache_avail += 8 * 8;
        rar->bytes_unconsumed += 8;
        rar->bytes_remaining -= 8;
        return (1);
      }
      break;
    case 7:
      if (br->avail_in >= 7) {
        br->cache_buffer =
           (br->cache_buffer << 56) |
            ((uint64_t)br->next_in[0]) << 48 |
            ((uint64_t)br->next_in[1]) << 40 |
            ((uint64_t)br->next_in[2]) << 32 |
            ((uint32_t)br->next_in[3]) << 24 |
            ((uint32_t)br->next_in[4]) << 16 |
            ((uint32_t)br->next_in[5]) << 8 |
             (uint32_t)br->next_in[6];
        br->next_in += 7;
        br->avail_in -= 7;
        br->cache_avail += 7 * 8;
        rar->bytes_unconsumed += 7;
        rar->bytes_remaining -= 7;
        return (1);
      }
      break;
    case 6:
      if (br->avail_in >= 6) {
        br->cache_buffer =
           (br->cache_buffer << 48) |
            ((uint64_t)br->next_in[0]) << 40 |
            ((uint64_t)br->next_in[1]) << 32 |
            ((uint32_t)br->next_in[2]) << 24 |
            ((uint32_t)br->next_in[3]) << 16 |
            ((uint32_t)br->next_in[4]) << 8 |
             (uint32_t)br->next_in[5];
        br->next_in += 6;
        br->avail_in -= 6;
        br->cache_avail += 6 * 8;
        rar->bytes_unconsumed += 6;
        rar->bytes_remaining -= 6;
        return (1);
      }
      break;
    case 0:
      /* We have enough compressed data in
       * the cache buffer.*/
      return (1);
    default:
      break;
    }
    if (br->avail_in <= 0) {

      if (rar->bytes_unconsumed > 0) {
        /* Consume as much as the decompressor
         * actually used. */
        __archive_read_consume(a, rar->bytes_unconsumed);
        rar->bytes_unconsumed = 0;
      }
      br->next_in = rar_read_ahead(a, 1, &(br->avail_in));
      if (br->next_in == NULL)
        return (0);
      if (br->avail_in == 0)
        return (0);
    }
    br->cache_buffer =
       (br->cache_buffer << 8) | *br->next_in++;
    br->avail_in--;
    br->cache_avail += 8;
    n -= 8;
    rar->bytes_unconsumed++;
    rar->bytes_remaining--;
  }
}